

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP_Server.cpp
# Opt level: O2

Content * __thiscall Jupiter::HTTP::Server::Directory::find(Directory *this,string_view in_name)

{
  pointer puVar1;
  Directory *pDVar2;
  pointer puVar3;
  Content *pCVar4;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  bool bVar5;
  uint uVar6;
  int iVar7;
  undefined4 extraout_var;
  pointer puVar8;
  pointer puVar9;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  string_view dir_name;
  
  local_40._M_str = in_name._M_str;
  local_40._M_len = in_name._M_len;
  dir_name._M_len = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_40,'/',0);
  if (dir_name._M_len == 0xffffffffffffffff) {
    uVar6 = calc_checksum<unsigned_int,std::basic_string_view<char,std::char_traits<char>>>
                      (&local_40);
    puVar3 = (this->content).
             super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar9 = (this->content).
                  super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar3; puVar9 = puVar9 + 1)
    {
      pCVar4 = (puVar9->_M_t).
               super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
               ._M_t.
               super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
               .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl;
      if ((pCVar4->name_checksum == uVar6) &&
         (__x._M_str = local_40._M_str, __x._M_len = local_40._M_len,
         __y_00._M_str = (pCVar4->name)._M_dataplus._M_p,
         __y_00._M_len = (pCVar4->name)._M_string_length, bVar5 = std::operator==(__x,__y_00), bVar5
         )) {
        return (puVar9->_M_t).
               super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
               ._M_t.
               super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
               .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl;
      }
    }
  }
  else {
    dir_name._M_str = local_40._M_str;
    local_40._M_str = local_40._M_str + dir_name._M_len + 1;
    local_40._M_len = local_40._M_len - (dir_name._M_len + 1);
    uVar6 = calc_checksum<unsigned_int,std::basic_string_view<char,std::char_traits<char>>>
                      (&dir_name);
    puVar1 = (this->directories).
             super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar8 = (this->directories).
                  super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar1; puVar8 = puVar8 + 1)
    {
      pDVar2 = (puVar8->_M_t).
               super___uniq_ptr_impl<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>
               ._M_t.
               super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Directory_*,_std::default_delete<Jupiter::HTTP::Server::Directory>_>
               .super__Head_base<0UL,_Jupiter::HTTP::Server::Directory_*,_false>._M_head_impl;
      if ((pDVar2->name_checksum == uVar6) &&
         (__x_00._M_str = dir_name._M_str, __x_00._M_len = dir_name._M_len,
         __y._M_str = (pDVar2->name)._M_dataplus._M_p, __y._M_len = (pDVar2->name)._M_string_length,
         bVar5 = std::operator==(__x_00,__y), bVar5)) {
        pDVar2 = (puVar8->_M_t).
                 super___uniq_ptr_impl<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Directory_*,_std::default_delete<Jupiter::HTTP::Server::Directory>_>
                 .super__Head_base<0UL,_Jupiter::HTTP::Server::Directory_*,_false>._M_head_impl;
        iVar7 = (*pDVar2->_vptr_Directory[3])(pDVar2,local_40._M_len,local_40._M_str);
        return (Content *)CONCAT44(extraout_var,iVar7);
      }
    }
  }
  return (Content *)0x0;
}

Assistant:

Jupiter::HTTP::Server::Content *Jupiter::HTTP::Server::Directory::find(std::string_view in_name) {
	std::string_view in_name_ref = in_name;
	while (!in_name_ref.empty() && in_name_ref.front() == '/') {
		in_name.remove_prefix(1);
	}

	size_t index = in_name_ref.find('/');
	if (index == std::string_view::npos) { // Search content
		unsigned int content_name_checksum = calc_checksum(in_name_ref);
		index = content.size();
		for (auto& content_item : content) {
			if (content_item->name_checksum == content_name_checksum && content_item->name == in_name_ref) {
				return content_item.get();
			}
		}
		return nullptr; // No such content
	}

	// Just use split_once?
	std::string_view dir_name(in_name_ref.data(), index);
	in_name_ref.remove_prefix(dir_name.size() + 1);
	unsigned int dir_name_checksum = calc_checksum(dir_name);

	for (auto& directory : directories) {
		if (directory->name_checksum == dir_name_checksum && directory->name == dir_name) {
			return directory->find(in_name_ref);
		}
	}

	return nullptr; // No such directory
}